

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar17 [16];
  
  pwVar8 = *it;
  if (0 < *(long *)(this + 8)) {
    pcVar11 = *(char **)this;
    uVar10 = *(long *)(this + 8) + 1;
    do {
      *pwVar8 = (int)*pcVar11;
      pcVar11 = pcVar11 + 1;
      pwVar8 = pwVar8 + 1;
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  auVar7 = _DAT_00138020;
  auVar6 = _DAT_00138010;
  auVar5 = _DAT_00137010;
  lVar3 = *(long *)(this + 0x18);
  pwVar9 = pwVar8;
  if (lVar3 != 0) {
    pwVar9 = pwVar8 + lVar3;
    wVar1 = *(wchar_t *)(this + 0x10);
    uVar10 = lVar3 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar14._8_4_ = (int)uVar10;
    auVar14._0_8_ = uVar10;
    auVar14._12_4_ = (int)(uVar10 >> 0x20);
    lVar13 = 0;
    auVar14 = auVar14 ^ _DAT_00137010;
    do {
      auVar16._8_4_ = (int)lVar13;
      auVar16._0_8_ = lVar13;
      auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar17 = (auVar16 | auVar7) ^ auVar5;
      iVar15 = auVar14._4_4_;
      if ((bool)(~(auVar17._4_4_ == iVar15 && auVar14._0_4_ < auVar17._0_4_ ||
                  iVar15 < auVar17._4_4_) & 1)) {
        pwVar8[lVar13] = wVar1;
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        pwVar8[lVar13 + 1] = wVar1;
      }
      auVar16 = (auVar16 | auVar6) ^ auVar5;
      iVar18 = auVar16._4_4_;
      if (iVar18 <= iVar15 && (iVar18 != iVar15 || auVar16._0_4_ <= auVar14._0_4_)) {
        pwVar8[lVar13 + 2] = wVar1;
        pwVar8[lVar13 + 3] = wVar1;
      }
      lVar13 = lVar13 + 4;
    } while ((uVar10 - ((uint)(lVar3 + 0x3fffffffffffffffU) & 3)) + 4 != lVar13);
  }
  uVar2 = *(uint *)(this + 0x24);
  pwVar8 = pwVar9 + uVar2;
  uVar12 = *(uint *)(this + 0x20);
  do {
    pwVar8 = pwVar8 + -1;
    *pwVar8 = uVar12 & 7 | 0x30;
    bVar4 = 7 < uVar12;
    uVar12 = uVar12 >> 3;
  } while (bVar4);
  *it = pwVar9 + uVar2;
  return;
}

Assistant:

FMT_CONSTEXPR size_t size() const { return size_; }